

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O2

shared_ptr<Liby::TcpServer> __thiscall
Liby::EventLoopGroup::creatTcpServer(EventLoopGroup *this,string *host,string *service)

{
  TcpServer *this_00;
  Logger *this_01;
  string *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int __fd;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  shared_ptr<Liby::Socket> sVar1;
  shared_ptr<Liby::TcpServer> sVar2;
  SockPtr sockPtr;
  __shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2> local_40;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  
  Resolver::resolve(&eps,service,in_RCX);
  if (eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node.
      super__List_node_base._M_next == (_List_node_base *)&eps) {
    this_01 = Logger::getLogger();
    Logger::log(this_01,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    *(undefined8 *)this = 0;
    *(undefined8 *)&(this->bf_).super__Function_base._M_functor = 0;
  }
  else {
    __fd = (int)eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl.
                _M_node.super__List_node_base._M_next + 0x10;
    sVar1 = std::make_shared<Liby::Socket,Liby::Endpoint&>((Endpoint *)&sockPtr);
    Socket::listen(sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,__fd,
                   (int)sVar1.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi);
    std::make_shared<Liby::TcpServer,Liby::EventLoop*&>((EventLoop **)this);
    this_00 = *(TcpServer **)this;
    std::__shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>);
    TcpServer::setServerSocket(this_00,(SockPtr *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    TcpServer::start(*(TcpServer **)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sockPtr.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::_M_clear
            (&eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>);
  sVar2.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpServer>)
         sVar2.super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpServer>
EventLoopGroup::creatTcpServer(const std::string &host,
                               const std::string &service) {
    auto eps = Resolver::resolve(host, service);
    if (eps.empty()) {
        error("host or service unavaiable");
        return nullptr;
    }

    SockPtr sockPtr = std::make_shared<Socket>(eps.front());

    try {
        sockPtr->listen();
    } catch(const char *err) {
        fatal(err);
    }

    std::shared_ptr<TcpServer> tcpServer =
        std::make_shared<TcpServer>(ploops_[0]);
    tcpServer->setServerSocket(sockPtr);

    tcpServer->start();

    return tcpServer;
}